

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

size_t crnlib::MyWrite(void *pp,void *data,size_t size)

{
  CSeqOutStreamBuf *p;
  size_t size_local;
  void *data_local;
  void *pp_local;
  
  p = (CSeqOutStreamBuf *)size;
  if (*(ulong *)((long)pp + 0x10) < size) {
    p = *(CSeqOutStreamBuf **)((long)pp + 0x10);
    *(undefined4 *)((long)pp + 0x18) = 1;
  }
  memcpy(*(void **)((long)pp + 8),data,(size_t)p);
  *(long *)((long)pp + 0x10) = *(long *)((long)pp + 0x10) - (long)p;
  *(long *)((long)pp + 8) = (long)&(p->funcTable).Write + *(long *)((long)pp + 8);
  return (size_t)p;
}

Assistant:

static size_t MyWrite(void* pp, const void* data, size_t size) {
  CSeqOutStreamBuf* p = (CSeqOutStreamBuf*)pp;
  if (p->rem < size) {
    size = p->rem;
    p->overflow = True;
  }
  memcpy(p->data, data, size);
  p->rem -= size;
  p->data += size;
  return size;
}